

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json_patch.c
# Opt level: O0

void test_json_patch_using_file(char *testdir,char *filename)

{
  FILE *__stream;
  long lVar1;
  int *piVar2;
  undefined8 uVar3;
  json_object *pjVar4;
  json_object *jo1;
  json_object *jo;
  size_t ii;
  char full_filename [4096];
  char *filename_local;
  char *testdir_local;
  
  full_filename._4088_8_ = filename;
  snprintf((char *)&ii,0x1000,"%s/%s",testdir,filename);
  printf("Testing using file %s\n",full_filename._4088_8_);
  lVar1 = json_object_from_file(&ii);
  __stream = _stderr;
  if (lVar1 == 0) {
    piVar2 = __errno_location();
    uVar3 = _json_c_strerror(*piVar2);
    fprintf(__stream,"FAIL: unable to open %s: %s\n",&ii,uVar3);
    exit(1);
  }
  jo = (json_object *)0x0;
  while( true ) {
    pjVar4 = (json_object *)json_object_array_length(lVar1);
    if (pjVar4 <= jo) break;
    pjVar4 = (json_object *)json_object_array_get_idx(lVar1,jo);
    test_json_patch_op(pjVar4);
    jo = jo + 1;
  }
  json_object_put(lVar1);
  return;
}

Assistant:

void test_json_patch_using_file(const char *testdir, const char *filename)
{
	char full_filename[PATH_MAX];
	(void)snprintf(full_filename, sizeof(full_filename), "%s/%s", testdir, filename);
	size_t ii;

	printf("Testing using file %s\n", filename);
	json_object *jo = json_object_from_file(full_filename);
	if (!jo) {
		fprintf(stderr, "FAIL: unable to open %s: %s\n", full_filename, strerror(errno));
		exit(EXIT_FAILURE);
	}

	for (ii = 0; ii < json_object_array_length(jo); ii++) {
		struct json_object *jo1 = json_object_array_get_idx(jo, ii);
		test_json_patch_op(jo1);
	}

	json_object_put(jo);
}